

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void set_switch(ecs_world_t *world,ecs_table_t *table,ecs_data_t *data,int32_t row,int32_t count,
               ecs_entities_t *entities,_Bool reset)

{
  int iVar1;
  ecs_entity_t *peVar2;
  ecs_switch_t *sw_00;
  int32_t iVar3;
  ulong add;
  int local_6c;
  int32_t r;
  ecs_switch_t *sw;
  uint64_t uStack_58;
  int32_t sw_index;
  ecs_entity_t sw_case;
  ecs_entity_t e;
  int32_t comp_count;
  int32_t i;
  ecs_entity_t *array;
  _Bool reset_local;
  ecs_entities_t *entities_local;
  int32_t count_local;
  int32_t row_local;
  ecs_data_t *data_local;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  peVar2 = entities->array;
  iVar1 = entities->count;
  e._4_4_ = 0;
  do {
    if (iVar1 <= e._4_4_) {
      return;
    }
    if ((peVar2[e._4_4_] & 0xff00000000000000) == 0xfc00000000000000) {
      add = peVar2[e._4_4_] & 0xffffffffffffff;
      uStack_58 = 0;
      if ((!reset) &&
         (_ecs_assert(add != 0,0xc,(char *)0x0,"sw_case != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x314), uStack_58 = add, add == 0)) {
        __assert_fail("sw_case != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x314,
                      "void set_switch(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool)"
                     );
      }
      iVar3 = ecs_table_switch_from_case(world,table,add);
      _ecs_assert(iVar3 != -1,0xc,(char *)0x0,"sw_index != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x318);
      if (iVar3 == -1) {
        __assert_fail("sw_index != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x318,
                      "void set_switch(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool)"
                     );
      }
      sw_00 = data->sw_columns[iVar3].data;
      _ecs_assert(sw_00 != (ecs_switch_t *)0x0,0xc,(char *)0x0,"sw != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x31a);
      if (sw_00 == (ecs_switch_t *)0x0) {
        __assert_fail("sw != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x31a,
                      "void set_switch(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool)"
                     );
      }
      for (local_6c = 0; local_6c < count; local_6c = local_6c + 1) {
        ecs_switch_set(sw_00,row + local_6c,uStack_58);
      }
    }
    e._4_4_ = e._4_4_ + 1;
  } while( true );
}

Assistant:

static
void set_switch(
    ecs_world_t *world,
    ecs_table_t *table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,    
    ecs_entities_t *entities,
    bool reset)
{
    ecs_entity_t *array = entities->array;
    int32_t i, comp_count = entities->count;

    for (i = 0; i < comp_count; i ++) {
        ecs_entity_t e = array[i];

        if (ECS_HAS_ROLE(e, CASE)) {
            e = e & ECS_COMPONENT_MASK;

            ecs_entity_t sw_case = 0;
            if (!reset) {
                sw_case = e;
                ecs_assert(sw_case != 0, ECS_INTERNAL_ERROR, NULL);
            }

            int32_t sw_index = ecs_table_switch_from_case(world, table, e);
            ecs_assert(sw_index != -1, ECS_INTERNAL_ERROR, NULL);
            ecs_switch_t *sw = data->sw_columns[sw_index].data;
            ecs_assert(sw != NULL, ECS_INTERNAL_ERROR, NULL);
            
            int32_t r;
            for (r = 0; r < count; r ++) {
                ecs_switch_set(sw, row + r, sw_case);
            }
        }
    }
}